

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O1

void __thiscall EOServer::ClearClientRejections(EOServer *this,connection_log_iterator it)

{
  string local_30;
  
  if (1 < *(int *)((long)it.
                         super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                         ._M_cur + 0x20)) {
    IPAddress::operator_cast_to_string
              (&local_30,
               (IPAddress *)
               ((long)it.
                      super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                      ._M_cur + 8));
    Console::Wrn("Connections from %s were rejected (%dx)",local_30._M_dataplus._M_p,
                 (ulong)*(uint *)((long)it.
                                        super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                                        ._M_cur + 0x20));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    *(undefined4 *)
     ((long)it.super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>.
            _M_cur + 0x20) = 0;
  }
  return;
}

Assistant:

void EOServer::ClearClientRejections(EOServer::connection_log_iterator it)
{
	int& rejections = it->second.rejections;

	if (rejections > 1)
	{
		Console::Wrn("Connections from %s were rejected (%dx)", std::string(it->first).c_str(), rejections);
		rejections = 0;
	}
}